

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

void av1_pick_and_set_high_precision_mv(AV1_COMP *cpi,int qindex)

{
  int iVar1;
  int in_ESI;
  AV1_COMP *in_RDI;
  MV_STATS *mv_stats;
  int use_hp;
  int in_stack_00000054;
  MV_STATS *in_stack_00000058;
  AV1_COMP *in_stack_00000060;
  uint allow_high_precision_mv;
  
  allow_high_precision_mv = (uint)(in_ESI < 0x80);
  if ((in_RDI->sf).hl_sf.high_precision_mv_usage == '\x02') {
    allow_high_precision_mv = 0;
  }
  else if ((((in_RDI->sf).hl_sf.high_precision_mv_usage == '\0') &&
           (iVar1 = av1_frame_allows_smart_mv((AV1_COMP *)CONCAT44(in_ESI,allow_high_precision_mv)),
           iVar1 != 0)) && ((in_RDI->mv_stats).valid != 0)) {
    allow_high_precision_mv =
         get_smart_mv_prec(in_stack_00000060,in_stack_00000058,in_stack_00000054);
  }
  av1_set_high_precision_mv
            (in_RDI,allow_high_precision_mv,
             (uint)((in_RDI->common).features.cur_frame_force_integer_mv & 1));
  return;
}

Assistant:

void av1_pick_and_set_high_precision_mv(AV1_COMP *cpi, int qindex) {
  int use_hp = qindex < HIGH_PRECISION_MV_QTHRESH;
#if !CONFIG_REALTIME_ONLY
  MV_STATS *mv_stats = &cpi->mv_stats;
#endif  // !CONFIG_REALTIME_ONLY

  if (cpi->sf.hl_sf.high_precision_mv_usage == QTR_ONLY) {
    use_hp = 0;
  }
#if !CONFIG_REALTIME_ONLY
  else if (cpi->sf.hl_sf.high_precision_mv_usage == LAST_MV_DATA &&
           av1_frame_allows_smart_mv(cpi) && mv_stats->valid) {
    use_hp = get_smart_mv_prec(cpi, mv_stats, qindex);
  }
#endif  // !CONFIG_REALTIME_ONLY

  av1_set_high_precision_mv(cpi, use_hp,
                            cpi->common.features.cur_frame_force_integer_mv);
}